

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

bool __thiscall spvtools::opt::Instruction::IsFloatingPointFoldingAllowed(Instruction *this)

{
  bool bVar1;
  uint32_t id;
  FeatureManager *pFVar2;
  DecorationManager *this_00;
  bool is_nocontract;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  pFVar2 = IRContext::get_feature_mgr(this->context_);
  bVar1 = EnumSet<spv::Capability>::contains(&pFVar2->capabilities_,Shader);
  if (bVar1) {
    pFVar2 = IRContext::get_feature_mgr(this->context_);
    bVar1 = EnumSet<spv::Capability>::contains(&pFVar2->capabilities_,DenormPreserve);
    if (!bVar1) {
      pFVar2 = IRContext::get_feature_mgr(this->context_);
      bVar1 = EnumSet<spv::Capability>::contains(&pFVar2->capabilities_,DenormFlushToZero);
      if (!bVar1) {
        pFVar2 = IRContext::get_feature_mgr(this->context_);
        bVar1 = EnumSet<spv::Capability>::contains(&pFVar2->capabilities_,SignedZeroInfNanPreserve);
        if (!bVar1) {
          pFVar2 = IRContext::get_feature_mgr(this->context_);
          bVar1 = EnumSet<spv::Capability>::contains(&pFVar2->capabilities_,RoundingModeRTZ);
          if (!bVar1) {
            pFVar2 = IRContext::get_feature_mgr(this->context_);
            bVar1 = EnumSet<spv::Capability>::contains(&pFVar2->capabilities_,RoundingModeRTE);
            if (!bVar1) {
              is_nocontract = false;
              this_00 = IRContext::get_decoration_mgr(this->context_);
              id = result_id(this);
              local_38._8_8_ = 0;
              local_20 = std::
                         _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.cpp:822:7)>
                         ::_M_invoke;
              local_28 = std::
                         _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.cpp:822:7)>
                         ::_M_manager;
              local_38._M_unused._M_object = &is_nocontract;
              analysis::DecorationManager::WhileEachDecoration
                        (this_00,id,0x2a,
                         (function<bool_(const_spvtools::opt::Instruction_&)> *)&local_38);
              if (local_28 != (code *)0x0) {
                (*local_28)(&local_38,&local_38,__destroy_functor);
              }
              return (bool)(is_nocontract ^ 1);
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Instruction::IsFloatingPointFoldingAllowed() const {
  // TODO: Add the rules for kernels.  For now it will be pessimistic.
  // For now, do not support capabilities introduced by SPV_KHR_float_controls.
  if (!context_->get_feature_mgr()->HasCapability(spv::Capability::Shader) ||
      context_->get_feature_mgr()->HasCapability(
          spv::Capability::DenormPreserve) ||
      context_->get_feature_mgr()->HasCapability(
          spv::Capability::DenormFlushToZero) ||
      context_->get_feature_mgr()->HasCapability(
          spv::Capability::SignedZeroInfNanPreserve) ||
      context_->get_feature_mgr()->HasCapability(
          spv::Capability::RoundingModeRTZ) ||
      context_->get_feature_mgr()->HasCapability(
          spv::Capability::RoundingModeRTE)) {
    return false;
  }

  bool is_nocontract = false;
  context_->get_decoration_mgr()->WhileEachDecoration(
      result_id(), uint32_t(spv::Decoration::NoContraction),
      [&is_nocontract](const Instruction&) {
        is_nocontract = true;
        return false;
      });
  return !is_nocontract;
}